

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

void ssl_buffering_free_slot(mbedtls_ssl_context *ssl,uint8_t slot)

{
  mbedtls_ssl_handshake_params *pmVar1;
  size_t len;
  ulong uVar2;
  mbedtls_ssl_hs_buffer *pmVar3;
  undefined7 in_register_00000031;
  
  if (slot < 4) {
    pmVar1 = ssl->handshake;
    uVar2 = CONCAT71(in_register_00000031,slot) & 0xffffffff;
    pmVar3 = (pmVar1->buffering).hs + uVar2;
    if ((undefined1  [24])((undefined1  [24])*pmVar3 & (undefined1  [24])0x1) !=
        (undefined1  [24])0x0) {
      len = (pmVar1->buffering).hs[uVar2].data_len;
      (pmVar1->buffering).total_bytes_buffered = (pmVar1->buffering).total_bytes_buffered - len;
      mbedtls_zeroize_and_free((pmVar1->buffering).hs[uVar2].data,len);
      *(undefined8 *)pmVar3 = 0;
      (pmVar1->buffering).hs[uVar2].data = (uchar *)0x0;
      (pmVar1->buffering).hs[uVar2].data_len = 0;
    }
  }
  return;
}

Assistant:

static void ssl_buffering_free_slot(mbedtls_ssl_context *ssl,
                                    uint8_t slot)
{
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;
    mbedtls_ssl_hs_buffer * const hs_buf = &hs->buffering.hs[slot];

    if (slot >= MBEDTLS_SSL_MAX_BUFFERED_HS) {
        return;
    }

    if (hs_buf->is_valid == 1) {
        hs->buffering.total_bytes_buffered -= hs_buf->data_len;
        mbedtls_zeroize_and_free(hs_buf->data, hs_buf->data_len);
        memset(hs_buf, 0, sizeof(mbedtls_ssl_hs_buffer));
    }
}